

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

bool __thiscall
libcellml::Generator::GeneratorImpl::isNegativeNumber
          (GeneratorImpl *this,AnalyserEquationAstPtr *ast)

{
  Type TVar1;
  element_type *peVar2;
  string local_48;
  double local_28;
  double doubleValue;
  AnalyserEquationAstPtr *ast_local;
  GeneratorImpl *this_local;
  
  doubleValue = (double)ast;
  ast_local = (AnalyserEquationAstPtr *)this;
  peVar2 = std::
           __shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ast);
  TVar1 = AnalyserEquationAst::type(peVar2);
  if (TVar1 == CN) {
    peVar2 = std::
             __shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)doubleValue);
    AnalyserEquationAst::value_abi_cxx11_(&local_48,peVar2);
    convertToDouble(&local_48,&local_28);
    std::__cxx11::string::~string((string *)&local_48);
    this_local._7_1_ = local_28 < 0.0;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Generator::GeneratorImpl::isNegativeNumber(const AnalyserEquationAstPtr &ast) const
{
    if (ast->type() == AnalyserEquationAst::Type::CN) {
        double doubleValue;

        convertToDouble(ast->value(), doubleValue);

        return doubleValue < 0.0;
    }

    return false;
}